

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.h
# Opt level: O1

void __thiscall decoder::Viterbi::Viterbi(Viterbi *this)

{
  correct_convolutional_sse *pcVar1;
  uint16_t poly [2];
  polynomial_t local_1c [2];
  
  (this->tmp_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tmp_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tmp_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c[0] = 0x4f;
  local_1c[1] = 0x6d;
  pcVar1 = correct_convolutional_sse_create(2,7,local_1c);
  this->v_ = pcVar1;
  return;
}

Assistant:

Viterbi() {
    // Initialize Viterbi decoder.
    // Polynomials are not referenced after creation
    // so can be referenced from the stack.
    uint16_t poly[2] = { (uint16_t)0x4f, (uint16_t)0x6d };
#ifdef HAVE_SSE
    v_ = correct_convolutional_sse_create(2, 7, poly);
#else
    v_ = correct_convolutional_create(2, 7, poly);
#endif
  }